

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O2

_Bool http_set_known_header(nng_http *conn,char *key,char *val)

{
  char *__s;
  int iVar1;
  nng_http_res *pnVar2;
  
  iVar1 = nni_strcasecmp(key,"Content-Type");
  if (iVar1 == 0) {
    nni_http_set_content_type(conn,val);
  }
  else {
    iVar1 = nni_strcasecmp(key,"Content-Length");
    if (iVar1 == 0) {
      pnVar2 = &conn->res;
      if (conn->client != false) {
        pnVar2 = (nng_http_res *)&conn->req;
      }
      __s = (pnVar2->data).clen;
      snprintf(__s,0x18,"%s",val);
      nni_http_set_static_header(conn,&(pnVar2->data).content_length,"Content-Length",__s);
    }
    else {
      if ((conn->client == false) || (iVar1 = nni_strcasecmp(key,"Host"), iVar1 != 0)) {
        return false;
      }
      nni_http_set_host(conn,val);
    }
  }
  return true;
}

Assistant:

static bool
http_set_known_header(nng_http *conn, const char *key, const char *val)
{
	if (nni_strcasecmp(key, "Content-Type") == 0) {
		nni_http_set_content_type(conn, val);
		return (true);
	}
	if (nni_strcasecmp(key, "Content-Length") == 0) {
		nni_http_entity *data =
		    conn->client ? &conn->req.data : &conn->res.data;
		snprintf(data->clen, sizeof(data->clen), "%s", val);
		nni_http_set_static_header(
		    conn, &data->content_length, "Content-Length", data->clen);
		return (true);
	}

	if (conn->client) {
		if (nni_strcasecmp(key, "Host") == 0) {
			nni_http_set_host(conn, val);
			return (true);
		}
	}
	return (false);
}